

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagBuilder.cpp
# Opt level: O0

void __thiscall Mond::DiagBuilder::WriteUntilFormatter(DiagBuilder *this,char expect)

{
  int iVar1;
  int iVar2;
  logic_error *this_00;
  int beg;
  char expect_local;
  DiagBuilder *this_local;
  
  iVar1 = this->m_pos;
  do {
    iVar2 = this->m_pos;
    this->m_pos = iVar2 + 1;
  } while (this->m_fmt[iVar2] != '%');
  std::ostream::write(&this->field_0x60,(long)(this->m_fmt + iVar1));
  iVar1 = this->m_pos;
  this->m_pos = iVar1 + 1;
  if (this->m_fmt[iVar1] == expect) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"invalid diagnostic format string");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void DiagBuilder::WriteUntilFormatter(char expect)
{
	auto beg = m_pos;

	while (m_fmt[m_pos++] != '%')
	{
	}

	m_msg.write(&m_fmt[beg], m_pos - beg - 1);

	if (m_fmt[m_pos++] != expect)
	{
		throw logic_error("invalid diagnostic format string");
	}
}